

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O1

Mat __thiscall Mat::DirectProduct(Mat *this,Mat *rhs)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  double *pdVar5;
  double dVar6;
  uint uVar7;
  double *pdVar8;
  double *in_RDX;
  double *extraout_RDX;
  ulong uVar9;
  double dVar10;
  double *pdVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  double *pdVar15;
  Mat MVar16;
  ulong local_68;
  double *local_60;
  
  uVar1 = rhs->n_rows_;
  uVar2 = rhs->n_cols_;
  uVar3 = *(uint *)in_RDX;
  uVar4 = *(uint *)((long)in_RDX + 4);
  uVar14 = uVar4 * uVar2;
  this->n_rows_ = uVar3 * uVar1;
  this->n_cols_ = uVar14;
  uVar7 = uVar3 * uVar1 * uVar14;
  if ((int)uVar7 < 1) {
    pdVar8 = (double *)0x0;
    local_60 = in_RDX;
  }
  else {
    pdVar8 = (double *)operator_new__((ulong)uVar7 << 3);
    local_60 = extraout_RDX;
  }
  this->v_ = pdVar8;
  if (0 < (int)uVar1) {
    pdVar5 = rhs->v_;
    dVar6 = in_RDX[1];
    local_60 = (double *)0x0;
    local_68 = 0;
    do {
      if (0 < (int)uVar2) {
        uVar9 = 0;
        pdVar11 = local_60;
        do {
          if (0 < (int)uVar3) {
            uVar13 = 0;
            dVar10 = dVar6;
            pdVar15 = pdVar11;
            do {
              if (0 < (int)uVar4) {
                uVar12 = 0;
                do {
                  pdVar8[(int)pdVar15 + (int)uVar12] =
                       pdVar5[uVar2 * (int)local_68 + uVar9] *
                       *(double *)((long)dVar10 + uVar12 * 8);
                  uVar12 = uVar12 + 1;
                } while (uVar4 != uVar12);
              }
              uVar13 = uVar13 + 1;
              dVar10 = (double)((long)dVar10 + (long)(int)uVar4 * 8);
              pdVar15 = (double *)((long)pdVar15 + (ulong)uVar14);
            } while (uVar13 != uVar3);
          }
          uVar9 = uVar9 + 1;
          pdVar11 = (double *)((long)pdVar11 + (ulong)uVar4);
        } while (uVar9 != uVar2);
      }
      local_68 = local_68 + 1;
      local_60 = (double *)((long)local_60 + (ulong)(uVar2 * uVar3 * uVar4));
    } while (local_68 != uVar1);
  }
  MVar16.v_ = local_60;
  MVar16._0_8_ = this;
  return MVar16;
}

Assistant:

Mat Mat::DirectProduct(const Mat &rhs) const
{
	Mat product(n_rows_*rhs.n_rows_, n_cols_*rhs.n_cols_);
	for (int im = 0; im < n_rows_ ; im++ )
	{
		for (int jm=0; jm<n_cols_; jm++)
		{
			for (int in=0; in<rhs.n_rows_ ; in++ )
			{
				for (int jn=0; jn<rhs.n_cols_; jn++)
				{
					int m = im*rhs.n_rows_ +in;
					int n = jm*rhs.n_cols_+ jn;
					product( m , n) = v_[im*n_cols_+jm] *  rhs.v_[in*rhs.n_cols_+jn];
				}
			}
		} 
	}
	return product;
}